

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

void __thiscall QMakeEvaluator::setupProject(QMakeEvaluator *this)

{
  long lVar1;
  ProFile *pPVar2;
  QList<ProString> *pQVar3;
  int iVar4;
  _List_node_base *this_00;
  long in_FS_OFFSET;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QFileInfo local_c0 [8];
  QString local_b8;
  ProString local_98;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  setTemplate(this);
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  this_00 = (this->m_valuemapStack).
            super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
            super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
            ._M_impl._M_node.super__List_node_base._M_prev + 1;
  iVar4 = 0;
  if ((lVar1 != 0) &&
     (pPVar2 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1], iVar4 = 0,
     pPVar2 != (ProFile *)0x0)) {
    iVar4 = pPVar2->m_id;
  }
  ProKey::ProKey(&local_68,"TARGET");
  pQVar3 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if ((lVar1 == 0) ||
     (pPVar2 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1],
     pPVar2 == (ProFile *)0x0)) {
    local_d8 = (QArrayData *)0x0;
    pcStack_d0 = (char16_t *)0x0;
    local_c8 = 0;
  }
  else {
    local_d8 = &((pPVar2->m_fileName).d.d)->super_QArrayData;
    pcStack_d0 = (pPVar2->m_fileName).d.ptr;
    local_c8 = (pPVar2->m_fileName).d.size;
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_d8->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QFileInfo::QFileInfo(local_c0,(QString *)&local_d8);
  QFileInfo::baseName();
  ProString::ProString(&local_98,&local_b8);
  local_98.m_file = iVar4;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_98);
  QList<ProString>::end(pQVar3);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QFileInfo::~QFileInfo(local_c0);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_68,"_PRO_FILE_");
  pQVar3 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if ((lVar1 == 0) ||
     (pPVar2 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1],
     pPVar2 == (ProFile *)0x0)) {
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
  }
  else {
    local_b8.d.d = (pPVar2->m_fileName).d.d;
    local_b8.d.ptr = (pPVar2->m_fileName).d.ptr;
    local_b8.d.size = (pPVar2->m_fileName).d.size;
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ProString::ProString(&local_98,&local_b8);
  local_98.m_file = iVar4;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_98);
  QList<ProString>::end(pQVar3);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_68,"_PRO_FILE_PWD_");
  pQVar3 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if ((lVar1 == 0) ||
     (pPVar2 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1],
     pPVar2 == (ProFile *)0x0)) {
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    local_b8.d.size = 0;
  }
  else {
    local_b8.d.d = (pPVar2->m_directoryName).d.d;
    local_b8.d.ptr = (pPVar2->m_directoryName).d.ptr;
    local_b8.d.size = (pPVar2->m_directoryName).d.size;
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_b8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  ProString::ProString(&local_98,&local_b8);
  local_98.m_file = iVar4;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_98);
  QList<ProString>::end(pQVar3);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  ProKey::ProKey(&local_68,"OUT_PWD");
  pQVar3 = &QMap<ProKey,_ProStringList>::operator[]
                      ((QMap<ProKey,_ProStringList> *)this_00,&local_68)->super_QList<ProString>;
  ProString::ProString(&local_98,&this->m_outputDir);
  local_98.m_file = iVar4;
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
            ((QMovableArrayOps<ProString> *)pQVar3,(pQVar3->d).size,&local_98);
  QList<ProString>::end(pQVar3);
  if (&(local_98.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_98.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_98.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::setupProject()
{
    setTemplate();
    ProValueMap &vars = m_valuemapStack.top();
    int proFile = currentFileId();
    vars[ProKey("TARGET")] << ProString(QFileInfo(currentFileName()).baseName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_")] << ProString(currentFileName()).setSource(proFile);
    vars[ProKey("_PRO_FILE_PWD_")] << ProString(currentDirectory()).setSource(proFile);
    vars[ProKey("OUT_PWD")] << ProString(m_outputDir).setSource(proFile);
}